

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O3

void __thiscall Js::ScriptContext::ClearRejitReasonCountsArray(ScriptContext *this)

{
  uint *puVar1;
  ushort uVar2;
  
  puVar1 = this->rejitReasonCounts;
  if (puVar1 != (uint *)0x0) {
    uVar2 = 0;
    do {
      puVar1[uVar2] = 0;
      uVar2 = uVar2 + 1;
    } while (uVar2 < 0x2d);
  }
  puVar1 = this->rejitReasonCountsCap;
  if (puVar1 != (uint *)0x0) {
    uVar2 = 0;
    do {
      puVar1[uVar2] = 0;
      uVar2 = uVar2 + 1;
    } while (uVar2 < 0x2d);
  }
  return;
}

Assistant:

void ScriptContext::ClearRejitReasonCountsArray()
    {
        if (this->rejitReasonCounts != nullptr)
        {
            for (UINT16 i = 0; i < NumRejitReasons; i++)
            {
                this->rejitReasonCounts[i] = 0;
            }
        }
        if (this->rejitReasonCountsCap != nullptr)
        {
            for (UINT16 i = 0; i < NumRejitReasons; i++)
            {
                this->rejitReasonCountsCap[i] = 0;
            }
        }
    }